

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_masabl_node(REF_NODE ref_node)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  if (0 < ref_node->max) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      if (-1 < ref_node->global[lVar2]) {
        dVar4 = cos((*(double *)((long)ref_node->real + lVar3) + -0.5) * 3.14159265358979);
        dVar4 = dVar4 * 0.2 + 0.01;
        dVar5 = exp(*(double *)((long)ref_node->real + lVar3 + 0x10) * 6.0);
        uVar1 = ref_node_metric_form
                          (ref_node,(REF_INT)lVar2,1.0 / (dVar4 * dVar4),0.0,0.0,99.99999999999999,
                           0.0,1.0 / (dVar5 * 0.001 * dVar5 * 0.001));
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x160,"ref_metric_masabl_node",(ulong)uVar1,"set node met");
          return uVar1;
        }
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x78;
    } while (lVar2 < ref_node->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_masabl_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL hx, hz, c, k1;

  each_ref_node_valid_node(ref_node, node) {
    hx =
        0.01 + 0.2 * cos(ref_math_pi * (ref_node_xyz(ref_node, 0, node) - 0.5));
    c = 0.001;
    k1 = 6.0;
    hz = c * exp(k1 * ref_node_xyz(ref_node, 2, node));
    RSS(ref_node_metric_form(ref_node, node, 1.0 / (hx * hx), 0, 0,
                             1.0 / (0.1 * 0.1), 0, 1.0 / (hz * hz)),
        "set node met");
  }

  return REF_SUCCESS;
}